

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  Node *block;
  undefined4 uVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  uint uVar5;
  ulong key;
  long lVar6;
  ulong uVar7;
  uint local_4c;
  AuxsetnodeT asn;
  
  uVar5 = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    local_4c = 0;
  }
  else {
    local_4c = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (uVar5 < nasize) {
    setarrayvector(L,t,nasize);
  }
  asn.t = t;
  asn.nhsize = nhsize;
  iVar2 = luaD_rawrunprotected(L,auxsetnode,&asn);
  if (iVar2 == 0) {
    if (nasize < uVar5) {
      t->sizearray = nasize;
      uVar7 = (ulong)nasize;
      lVar6 = uVar7 << 4;
      key = uVar7;
      while (pTVar3 = t->array, key < uVar5) {
        key = key + 1;
        if (*(int *)((long)&pTVar3->tt_ + lVar6) != 0) {
          luaH_setint(L,t,key,(TValue *)((long)&pTVar3->value_ + lVar6));
        }
        lVar6 = lVar6 + 0x10;
      }
      pTVar3 = (TValue *)luaM_realloc_(L,pTVar3,(ulong)uVar5 << 4,uVar7 << 4);
      t->array = pTVar3;
    }
    pTVar3 = (TValue *)&block[(ulong)local_4c - 1].i_key;
    for (uVar5 = local_4c; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
      if (pTVar3[-1].tt_ != 0) {
        pTVar4 = luaH_set(L,t,pTVar3);
        iVar2 = pTVar3[-1].tt_;
        uVar1 = *(undefined4 *)&pTVar3[-1].field_0xc;
        pTVar4->value_ = pTVar3[-1].value_;
        pTVar4->tt_ = iVar2;
        *(undefined4 *)&pTVar4->field_0xc = uVar1;
      }
      pTVar3 = pTVar3 + -2;
    }
    if (0 < (int)local_4c) {
      luaM_realloc_(L,block,(ulong)local_4c * 0x20,0);
    }
    return;
  }
  setarrayvector(L,t,uVar5);
  luaD_throw(L,4);
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}